

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O1

char * __thiscall
kj::_::Delimited<kj::ArrayPtr<void_*const>_&>::flattenTo
          (Delimited<kj::ArrayPtr<void_*const>_&> *this,char *target,char *limit)

{
  size_t sVar1;
  char *pcVar2;
  bool bVar3;
  long lVar4;
  void **ppvVar5;
  char *pcVar6;
  void **elem;
  void **ppvVar7;
  char *pcVar8;
  char *__dest;
  char *local_60;
  CappedArray<char,_17UL> local_50;
  
  sVar1 = this->array->size_;
  if (sVar1 != 0) {
    ppvVar7 = this->array->ptr;
    ppvVar5 = ppvVar7 + sVar1;
    bVar3 = true;
    pcVar6 = target;
    do {
      __dest = pcVar6;
      pcVar2 = pcVar6;
      if (pcVar6 != limit) {
        if (bVar3) {
          bVar3 = false;
        }
        else {
          pcVar2 = (this->delimiter).content.ptr;
          sVar1 = (this->delimiter).content.size_;
          if (pcVar2 != pcVar2 + (sVar1 - 1)) {
            lVar4 = 1;
            do {
              *__dest = pcVar2[lVar4 + -1];
              __dest = __dest + 1;
              if ((2 - sVar1) + lVar4 == 1) break;
              lVar4 = lVar4 + 1;
            } while (__dest != limit);
          }
        }
        Stringifier::operator*(&local_50,(Stringifier *)&STR,*ppvVar7);
        pcVar2 = local_60;
        if (__dest != limit && local_50.currentSize != 0) {
          pcVar8 = (char *)(local_50.currentSize - 1);
          if (limit + ~(ulong)__dest < (char *)(local_50.currentSize - 1)) {
            pcVar8 = limit + ~(ulong)__dest;
          }
          memcpy(__dest,local_50.content,(size_t)(pcVar8 + 1));
          __dest = __dest + (long)pcVar8 + 1;
        }
      }
      local_60 = pcVar2;
      target = local_60;
    } while ((pcVar6 != limit) &&
            (ppvVar7 = ppvVar7 + 1, pcVar6 = __dest, target = __dest, ppvVar7 != ppvVar5));
  }
  return target;
}

Assistant:

char* flattenTo(char* __restrict__ target, char* limit) {
    // This is called in the strPreallocated(). We want to avoid allocation. size() will not have
    // been called in this case, so hopefully `stringified` is still uninitialized. We will
    // stringify each item and immediately use it.
    bool first = true;
    for (auto&& elem: array) {
      if (target == limit) return target;
      if (first) {
        first = false;
      } else {
        target = fillLimited(target, limit, delimiter);
      }
      target = fillLimited(target, limit, kj::toCharSequence(elem));
    }
    return target;
  }